

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Tree::_clear_range(Tree *this,size_t first,size_t num)

{
  ulong uVar1;
  undefined8 *puVar2;
  undefined4 *puVar3;
  NodeData *pNVar4;
  code *pcVar5;
  Location LVar6;
  undefined1 auVar7 [24];
  bool bVar8;
  size_t e;
  long lVar9;
  char msg [51];
  char local_98 [24];
  char *pcStack_80;
  char local_78 [32];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  if (num != 0) {
    uVar1 = num + first;
    if (this->m_cap < uVar1) {
      builtin_strncpy(local_78,"st + num <= m_cap)",0x13);
      builtin_strncpy(local_98 + 0x10,"irst >= ",8);
      pcStack_80 = (char *)0x7269662026262030;
      builtin_strncpy(local_98,"check failed: (f",0x10);
      if ((s_error_flags & 1) != 0) {
        bVar8 = is_debugger_attached();
        if (bVar8) {
          pcVar5 = (code *)swi(3);
          (*pcVar5)();
          return;
        }
      }
      local_58 = 0;
      uStack_50 = 0x636f;
      local_48 = 0;
      pcStack_40 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_38 = 0x65;
      auVar7 = ZEXT1224(ZEXT412(0x636f) << 0x40);
      LVar6.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar6.super_LineCol.offset = auVar7._0_8_;
      LVar6.super_LineCol.line = auVar7._8_8_;
      LVar6.super_LineCol.col = auVar7._16_8_;
      LVar6.name.len = 0x65;
      (*(this->m_callbacks).m_error)(local_98,0x33,LVar6,(this->m_callbacks).m_user_data);
    }
    memset(this->m_buf + first,0,num * 0x90);
    if (first < uVar1) {
      lVar9 = first * 0x90;
      do {
        if (this->m_cap <= first) {
          if ((s_error_flags & 1) != 0) {
            bVar8 = is_debugger_attached();
            if (bVar8) {
              pcVar5 = (code *)swi(3);
              (*pcVar5)();
              return;
            }
          }
          local_98[0] = '\0';
          local_98[1] = '\0';
          local_98[2] = '\0';
          local_98[3] = '\0';
          local_98[4] = '\0';
          local_98[5] = '\0';
          local_98[6] = '\0';
          local_98[7] = '\0';
          local_98[8] = -0x7d;
          local_98[9] = 'K';
          local_98[10] = '\0';
          local_98[0xb] = '\0';
          local_98[0xc] = '\0';
          local_98[0xd] = '\0';
          local_98[0xe] = '\0';
          local_98[0xf] = '\0';
          local_98[0x10] = '\0';
          local_98[0x11] = '\0';
          local_98[0x12] = '\0';
          local_98[0x13] = '\0';
          local_98[0x14] = '\0';
          local_98[0x15] = '\0';
          local_98[0x16] = '\0';
          local_98[0x17] = '\0';
          pcStack_80 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_78[0] = 'e';
          local_78[1] = '\0';
          local_78[2] = '\0';
          local_78[3] = '\0';
          local_78[4] = '\0';
          local_78[5] = '\0';
          local_78[6] = '\0';
          local_78[7] = '\0';
          (*(code *)PTR_error_impl_0023e4c8)
                    ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                     (anonymous_namespace)::s_default_callbacks);
        }
        pNVar4 = this->m_buf;
        puVar2 = (undefined8 *)((long)&(pNVar4->m_val).scalar.len + lVar9);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)((long)&(pNVar4->m_val).tag.len + lVar9);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)((long)&(pNVar4->m_key).anchor.len + lVar9);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)((long)&(pNVar4->m_key).scalar.len + lVar9);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)((long)&(pNVar4->m_key).tag.len + lVar9);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)((long)&(pNVar4->m_type).type + lVar9);
        *puVar2 = 0;
        puVar2[1] = 0;
        *(undefined8 *)((long)&(pNVar4->m_val).anchor.len + lVar9) = 0;
        puVar3 = (undefined4 *)((long)&pNVar4->m_parent + lVar9);
        *puVar3 = 0xffffffff;
        puVar3[1] = 0xffffffff;
        puVar3[2] = 0xffffffff;
        puVar3[3] = 0xffffffff;
        *(undefined8 *)((long)&pNVar4->m_last_child + lVar9) = 0xffffffffffffffff;
        pNVar4 = this->m_buf;
        *(size_t *)((long)&pNVar4->m_prev_sibling + lVar9) = first - 1;
        first = first + 1;
        *(size_t *)((long)&pNVar4->m_next_sibling + lVar9) = first;
        lVar9 = lVar9 + 0x90;
      } while (first != uVar1);
    }
    this->m_buf[uVar1 - 1].m_next_sibling = 0xffffffffffffffff;
  }
  return;
}

Assistant:

void Tree::_clear_range(size_t first, size_t num)
{
    if(num == 0)
        return; // prevent overflow when subtracting
    _RYML_CB_ASSERT(m_callbacks, first >= 0 && first + num <= m_cap);
    memset(m_buf + first, 0, num * sizeof(NodeData)); // TODO we should not need this
    for(size_t i = first, e = first + num; i < e; ++i)
    {
        _clear(i);
        NodeData *n = m_buf + i;
        n->m_prev_sibling = i - 1;
        n->m_next_sibling = i + 1;
    }
    m_buf[first + num - 1].m_next_sibling = NONE;
}